

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void TableSettingsHandler_WriteAll
               (ImGuiContext *ctx,ImGuiSettingsHandler *handler,ImGuiTextBuffer *buf)

{
  float fVar1;
  uint uVar2;
  int iVar3;
  undefined1 auVar4 [16];
  char cVar5;
  byte bVar6;
  int iVar7;
  char *pcVar8;
  undefined8 uVar9;
  uint uVar10;
  ulong uVar11;
  uint *puVar12;
  byte *pbVar13;
  uint uVar14;
  
  pcVar8 = (ctx->SettingsTables).Buf.Data;
  if (pcVar8 != (char *)0x0) {
    puVar12 = (uint *)(pcVar8 + 4);
    do {
      if (*puVar12 != 0) {
        uVar2 = puVar12[1];
        uVar14 = -(uint)((uVar2 & 0xf) == 0);
        if ((uVar14 & 1) == 0) {
          iVar3 = (buf->Buf).Size;
          iVar7 = iVar3 + -1;
          if (iVar3 == 0) {
            iVar7 = 0;
          }
          ImGuiTextBuffer::reserve(buf,iVar7 + (char)puVar12[3] * 0x32 + 0x1e);
          uVar10 = *puVar12;
          ImGuiTextBuffer::appendf
                    (buf,"[%s][0x%08X,%d]\n",handler->TypeName,(ulong)uVar10,
                     (ulong)(uint)(int)(char)puVar12[3]);
          fVar1 = (float)puVar12[2];
          if ((fVar1 != 0.0) || (NAN(fVar1))) {
            ImGuiTextBuffer::appendf(buf,"RefScale=%g\n",(double)fVar1);
          }
          cVar5 = (char)puVar12[3];
          if ('\0' < cVar5) {
            auVar4._4_4_ = -(uint)((uVar2 & 8) == 0);
            auVar4._0_4_ = uVar14;
            auVar4._8_4_ = -(uint)((uVar2 & 2) == 0);
            auVar4._12_4_ = -(uint)((uVar2 & 4) == 0);
            uVar14 = movmskps(uVar10,auVar4);
            pbVar13 = (byte *)((long)puVar12 + 0x1b);
            uVar11 = 0;
            do {
              if ((*(int *)(pbVar13 + -7) == 0 && (uVar2 & 7) == 0) && (uVar14 & 2) == 0) {
                if (pbVar13[-1] != 0xff) goto LAB_00237330;
              }
              else if (*(int *)(pbVar13 + -7) != 0 || (uVar2 & 7) != 0) {
LAB_00237330:
                ImGuiTextBuffer::appendf(buf,"Column %-2d",uVar11);
                if (*(int *)(pbVar13 + -7) != 0) {
                  ImGuiTextBuffer::appendf(buf," UserID=%08X");
                }
                if ((uVar2 & 1) != 0) {
                  bVar6 = *pbVar13;
                  if ((bVar6 & 8) != 0) {
                    ImGuiTextBuffer::appendf(buf," Weight=%.4f",(double)*(float *)(pbVar13 + -0xb));
                    bVar6 = *pbVar13;
                  }
                  if ((bVar6 & 8) == 0) {
                    ImGuiTextBuffer::appendf
                              (buf," Width=%d",(ulong)(uint)(int)*(float *)(pbVar13 + -0xb));
                  }
                }
                if ((byte)((byte)uVar14 >> 3) == 0) {
                  ImGuiTextBuffer::appendf(buf," Visible=%d",(ulong)(*pbVar13 >> 2 & 1));
                }
                if ((uVar14 & 4) == 0) {
                  ImGuiTextBuffer::appendf(buf," Order=%d",(ulong)(uint)(int)(char)pbVar13[-2]);
                }
                if (((uVar14 & 2) == 0) && ((int)(char)pbVar13[-1] != 0xffffffff)) {
                  uVar9 = 0x5e;
                  if ((*pbVar13 & 3) == 1) {
                    uVar9 = 0x76;
                  }
                  ImGuiTextBuffer::appendf
                            (buf," Sort=%d%c",(ulong)(uint)(int)(char)pbVar13[-1],uVar9);
                }
                ImGuiTextBuffer::append(buf,"\n",(char *)0x0);
                cVar5 = (char)puVar12[3];
              }
              uVar10 = (int)uVar11 + 1;
              uVar11 = (ulong)uVar10;
              pbVar13 = pbVar13 + 0xc;
            } while ((int)uVar10 < (int)cVar5);
          }
          ImGuiTextBuffer::append(buf,"\n",(char *)0x0);
          pcVar8 = (ctx->SettingsTables).Buf.Data;
        }
      }
      puVar12 = (uint *)((long)puVar12 + (long)(int)puVar12[-1]);
    } while (puVar12 != (uint *)(pcVar8 + (long)(ctx->SettingsTables).Buf.Size + 4));
  }
  return;
}

Assistant:

static void TableSettingsHandler_WriteAll(ImGuiContext* ctx, ImGuiSettingsHandler* handler, ImGuiTextBuffer* buf)
{
    ImGuiContext& g = *ctx;
    for (ImGuiTableSettings* settings = g.SettingsTables.begin(); settings != NULL; settings = g.SettingsTables.next_chunk(settings))
    {
        if (settings->ID == 0) // Skip ditched settings
            continue;

        // TableSaveSettings() may clear some of those flags when we establish that the data can be stripped
        // (e.g. Order was unchanged)
        const bool save_size    = (settings->SaveFlags & ImGuiTableFlags_Resizable) != 0;
        const bool save_visible = (settings->SaveFlags & ImGuiTableFlags_Hideable) != 0;
        const bool save_order   = (settings->SaveFlags & ImGuiTableFlags_Reorderable) != 0;
        const bool save_sort    = (settings->SaveFlags & ImGuiTableFlags_Sortable) != 0;
        if (!save_size && !save_visible && !save_order && !save_sort)
            continue;

        buf->reserve(buf->size() + 30 + settings->ColumnsCount * 50); // ballpark reserve
        buf->appendf("[%s][0x%08X,%d]\n", handler->TypeName, settings->ID, settings->ColumnsCount);
        if (settings->RefScale != 0.0f)
            buf->appendf("RefScale=%g\n", settings->RefScale);
        ImGuiTableColumnSettings* column = settings->GetColumnSettings();
        for (int column_n = 0; column_n < settings->ColumnsCount; column_n++, column++)
        {
            // "Column 0  UserID=0x42AD2D21 Width=100 Visible=1 Order=0 Sort=0v"
            bool save_column = column->UserID != 0 || save_size || save_visible || save_order || (save_sort && column->SortOrder != -1);
            if (!save_column)
                continue;
            buf->appendf("Column %-2d", column_n);
            if (column->UserID != 0)                    buf->appendf(" UserID=%08X", column->UserID);
            if (save_size && column->IsStretch)         buf->appendf(" Weight=%.4f", column->WidthOrWeight);
            if (save_size && !column->IsStretch)        buf->appendf(" Width=%d", (int)column->WidthOrWeight);
            if (save_visible)                           buf->appendf(" Visible=%d", column->IsEnabled);
            if (save_order)                             buf->appendf(" Order=%d", column->DisplayOrder);
            if (save_sort && column->SortOrder != -1)   buf->appendf(" Sort=%d%c", column->SortOrder, (column->SortDirection == ImGuiSortDirection_Ascending) ? 'v' : '^');
            buf->append("\n");
        }
        buf->append("\n");
    }
}